

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O0

char * __thiscall
pstore::http::
buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(int,pstore::gsl::span<unsigned_char,-1l>const&)>>
::gets_abi_cxx11_(buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>
                  *this,char *__s)

{
  int in_EDX;
  string local_40;
  char *pcStack_18;
  int io_local;
  buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
  *this_local;
  
  pcStack_18 = __s;
  this_local = (buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
                *)this;
  std::__cxx11::string::string((string *)&local_40);
  buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
  ::gets_impl((gets_result_type *)this,
              (buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
               *)__s,in_EDX,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return (char *)this;
}

Assistant:

auto buffered_reader<IO, RefillFunction>::gets (IO io) -> gets_result_type {
            return this->gets_impl (io, std::string{});
        }